

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O3

void hashmap_clear(hashmap *map,_Bool update_cap)

{
  void *pvVar1;
  ulong uVar2;
  size_t sVar3;
  undefined7 in_register_00000031;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  map->count = 0;
  free_elements(map);
  sVar3 = map->nbuckets;
  if ((int)CONCAT71(in_register_00000031,update_cap) == 0) {
    if (sVar3 != map->cap) {
      pvVar1 = (*map->malloc)(map->cap * map->bucketsz);
      if (pvVar1 != (void *)0x0) {
        (*map->free)(map->buckets);
        map->buckets = pvVar1;
      }
      sVar3 = map->cap;
      map->nbuckets = sVar3;
    }
  }
  else {
    map->cap = sVar3;
  }
  memset(map->buckets,0,sVar3 * map->bucketsz);
  sVar3 = map->nbuckets;
  map->mask = sVar3 - 1;
  auVar5._8_4_ = (int)(sVar3 >> 0x20);
  auVar5._0_8_ = sVar3;
  auVar5._12_4_ = 0x45300000;
  dVar6 = (auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  dVar4 = ((double)map->loadfactor / 100.0) * dVar6;
  uVar2 = (ulong)dVar4;
  map->growat = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  dVar6 = dVar6 * 0.1;
  uVar2 = (ulong)dVar6;
  map->shrinkat = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  return;
}

Assistant:

void hashmap_clear(struct hashmap *map, bool update_cap) {
    map->count = 0;
    free_elements(map);
    if (update_cap) {
        map->cap = map->nbuckets;
    } else if (map->nbuckets != map->cap) {
        void *new_buckets = map->malloc(map->bucketsz*map->cap);
        if (new_buckets) {
            map->free(map->buckets);
            map->buckets = new_buckets;
        }
        map->nbuckets = map->cap;
    }
    memset(map->buckets, 0, map->bucketsz*map->nbuckets);
    map->mask = map->nbuckets-1;
    map->growat = map->nbuckets * (map->loadfactor / 100.0) ;
    map->shrinkat = map->nbuckets * SHRINK_AT;
}